

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lab3_main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *this;
  undefined1 local_270 [8];
  Interpreter i;
  ostream local_218 [8];
  ofstream out;
  char **argv_local;
  int argc_local;
  
  if (argc < 3) {
    this = std::operator<<((ostream *)&std::cout,"Usage infile outfile.");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::ofstream::ofstream(local_218);
    std::ofstream::open(local_218,argv[2],0x10);
    Interpreter::Interpreter((Interpreter *)local_270);
    Interpreter::run((Interpreter *)local_270,argv[1],local_218,PROJ5);
    Interpreter::~Interpreter((Interpreter *)local_270);
    std::ofstream::~ofstream(local_218);
  }
  return 0;
}

Assistant:

int main (int argc, char** argv)
{
  if (argc < 3)
  {
    cout << "Usage infile outfile." << endl;
    return 0;
  }

  ofstream out;
  out.open(argv[2]);

  Interpreter i = Interpreter();
  i.run(argv[1], out, PROJ5);
}